

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall
Vault::AppRoleStrategy::AppRoleStrategy(AppRoleStrategy *this,RoleId *roleId,SecretId *secretId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_41;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__AppRoleStrategy_001c5510;
  std::__cxx11::string::string((string *)&this->roleId_,(string *)roleId);
  std::__cxx11::string::string((string *)&this->secretId_,(string *)secretId);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"approle",&local_41);
  paVar1 = &(this->mount_).value_.field_2;
  (this->mount_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->mount_).value_.field_2 + 8) = uStack_28;
  }
  else {
    (this->mount_).value_._M_dataplus._M_p = local_40;
    (this->mount_).value_.field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (this->mount_).value_._M_string_length = local_38;
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

explicit AppRoleStrategy(RoleId roleId, SecretId secretId)
      : roleId_(std::move(roleId)), secretId_(std::move(secretId)),
        mount_(Path{"approle"}) {}